

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_utility.h
# Opt level: O0

tuple<std::vector<int,_std::allocator<int>_>_> *
testinator::Arbitrary<std::tuple<std::vector<int,_std::allocator<int>_>_>_>::generate_n
          (tuple<std::vector<int,_std::allocator<int>_>_> *__return_storage_ptr__,size_t n,
          unsigned_long randomSeed)

{
  enable_if_t<is_tuple<std::decay_t<tuple<>_>_>::value> *in_R8;
  undefined1 local_49;
  vector<int,_std::allocator<int>_> local_48;
  unsigned_long local_30;
  result_type r2;
  unsigned_long r1;
  unsigned_long randomSeed_local;
  size_t n_local;
  
  r2 = randomSeed;
  r1 = randomSeed;
  randomSeed_local = n;
  n_local = (size_t)__return_storage_ptr__;
  local_30 = anon_unknown_19::nextRandom(randomSeed);
  anon_unknown_19::Arbitrary_RandomSequence<std::vector<int,_std::allocator<int>_>_>::generate_n
            (&local_48,randomSeed_local,r2);
  Arbitrary<std::tuple<>_>::generate_n(randomSeed_local,local_30);
  tuple_cons<std::vector<int,std::allocator<int>>,std::tuple<>>
            (__return_storage_ptr__,(testinator *)&local_48,
             (vector<int,_std::allocator<int>_> *)&local_49,(tuple<> *)0x0,in_R8);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

static std::tuple<Ts...> generate_n(std::size_t n, unsigned long int randomSeed)
    {
      auto r1 = randomSeed;
      auto r2 = nextRandom(r1);

      using H = std::tuple_element_t<0, std::tuple<Ts...>>;
      using T = decltype(tuple_tail(std::declval<std::tuple<Ts...>>()));
      return tuple_cons(Arbitrary<H>::generate_n(n, r1),
                        Arbitrary<T>::generate_n(n, r2));
    }